

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

ostream * __thiscall nivalis::Expr::to_bin(Expr *this,ostream *os)

{
  pointer pAVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  ASTNode val;
  
  util::write_bin<unsigned_long>
            (os,(long)(this->ast).
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->ast).
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4);
  lVar3 = 8;
  uVar2 = 0;
  while( true ) {
    pAVar1 = (this->ast).
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    val.field_1.ref =
         (long)(this->ast).
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)pAVar1 >> 4;
    if (val.field_1.ref <= uVar2) break;
    val._0_8_ = *(undefined8 *)((long)&pAVar1->opcode + lVar3);
    util::write_bin<nivalis::Expr::ASTNode>
              ((util *)os,(ostream *)(ulong)*(uint *)((long)pAVar1 + lVar3 + -8),val);
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x10;
  }
  return os;
}

Assistant:

std::ostream& Expr::to_bin(std::ostream& os) const {
    util::write_bin(os, ast.size());
    for (size_t i = 0; i < ast.size(); ++i) {
        util::write_bin(os, ast[i]);
    }
    return os;
}